

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_rep_cycles.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
::update_representative_cycles
          (RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>
           *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  pointer puVar1;
  iterator __position;
  mapped_type *pmVar2;
  ulong uVar3;
  size_type __new_size;
  node_ptr plVar4;
  uint local_40;
  value_type_conflict local_3c;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  this_00 = &this->birthToCycle_;
  puVar1 = (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->birthToCycle_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_3c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,(ulong)*(uint *)&this[1].birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,&local_3c);
  __new_size = 0;
  if (*(int *)&this[1].birthToCycle_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar3 = 0;
    do {
      local_3c = (value_type_conflict)uVar3;
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)(this + 1),&local_3c);
      plVar4 = (pmVar2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
      if (plVar4 == (node_ptr)0x0 || plVar4 == (node_ptr)&pmVar2->column_) {
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3] = (uint)__new_size;
        __new_size = (size_type)((uint)__new_size + 1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(uint *)&this[1].birthToCycle_.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_erase_at_end(&this->representativeCycles_,
                    (this->representativeCycles_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->representativeCycles_,__new_size);
  local_40 = 0;
  if (*(int *)&this[3].representativeCycles_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_38 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this[2].birthToCycle_;
    do {
      local_3c = local_40;
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(local_38,&local_3c);
      for (plVar4 = (pmVar2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
          plVar4 != (node_ptr)&pmVar2->column_; plVar4 = plVar4->next_) {
        if (plVar4 == (node_ptr)0x0) {
          __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                        "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>::Matrix_column_tag, Type = 1]"
                       );
        }
        uVar3 = (ulong)(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[*(uint *)&plVar4[1].next_];
        if (uVar3 != 0xffffffff) {
          this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    ((this->representativeCycles_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar3);
          __position._M_current = *(uint **)(this_01 + 8);
          if (__position._M_current == *(uint **)(this_01 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_01,__position,&local_40);
          }
          else {
            *__position._M_current = local_40;
            *(uint **)(this_01 + 8) = __position._M_current + 1;
          }
        }
      }
      local_40 = local_40 + 1;
    } while (local_40 <
             *(uint *)&this[3].representativeCycles_.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void RU_representative_cycles<Master_matrix>::update_representative_cycles() 
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    Index c = 0;
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        birthToCycle_[i] = c;
        ++c;
      }
    }
    representativeCycles_.clear();
    representativeCycles_.resize(c);
    for (Index i = 0; i < _matrix()->mirrorMatrixU_.get_number_of_columns(); i++) {
      for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
        auto idx = birthToCycle_[entry.get_row_index()];
        if (idx != Master_matrix::template get_null_value<Index>()) {
          representativeCycles_[idx].push_back(i);
        }
      }
    }
  } else {
    birthToCycle_.clear();
    birthToCycle_.resize(_matrix()->reducedMatrixR_.get_number_of_columns(), -1);
    for (Index i = 0; i < _matrix()->reducedMatrixR_.get_number_of_columns(); i++) {
      if (_matrix()->reducedMatrixR_.is_zero_column(i)) {
        representativeCycles_.push_back(Cycle());
        for (const auto& entry : _matrix()->mirrorMatrixU_.get_column(i)) {
          representativeCycles_.back().push_back(entry.get_row_index());
        }
        if constexpr (std::is_same_v<typename Master_matrix::Column, typename Master_matrix::Matrix_heap_column> ||
                      std::is_same_v<typename Master_matrix::Column,
                                     typename Master_matrix::Matrix_unordered_set_column>)
          std::sort(representativeCycles_.back().begin(), representativeCycles_.back().end());
        birthToCycle_[i] = representativeCycles_.size() - 1;
      }
    }
  }
}